

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::StochasticTask::StochasticTask
          (StochasticTask *this,KnownSystemName knownNameId,SubroutineKind subroutineKind,
          size_t inputArgs,size_t outputArgs)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,knownNameId,subroutineKind);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_0058dc38;
  this->inputArgs = inputArgs;
  this->outputArgs = outputArgs;
  (this->super_SystemSubroutine).hasOutputArgs = outputArgs != 0;
  return;
}

Assistant:

StochasticTask(KnownSystemName knownNameId, SubroutineKind subroutineKind, size_t inputArgs,
                   size_t outputArgs) :
        SystemSubroutine(knownNameId, subroutineKind), inputArgs(inputArgs),
        outputArgs(outputArgs) {
        hasOutputArgs = outputArgs > 0;
    }